

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

bool __thiscall spvtools::opt::SSAPropagator::Run(SSAPropagator *this,Function *fn)

{
  _Elt_pointer ppBVar1;
  _Elt_pointer ppIVar2;
  bool bVar3;
  bool bVar4;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  Initialize(this,fn);
  bVar4 = false;
  do {
    ppBVar1 = (this->blocks_).c.
              super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->blocks_).c.
        super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppBVar1) {
      ppIVar2 = (this->ssa_edge_uses_).c.
                super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->ssa_edge_uses_).c.
          super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar2) {
        local_50._8_8_ = 0;
        local_38 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:264:19)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:264:19)>
                   ::_M_manager;
        local_50._M_unused._M_object = this;
        opt::Function::ForEachInst
                  (fn,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false,false);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        return bVar4;
      }
      bVar3 = Simulate(this,*ppIVar2);
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_front(&(this->ssa_edge_uses_).c);
    }
    else {
      bVar3 = Simulate(this,*ppBVar1);
      std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      pop_front(&(this->blocks_).c);
    }
    bVar4 = (bool)(bVar4 | bVar3);
  } while( true );
}

Assistant:

bool SSAPropagator::Run(Function* fn) {
  Initialize(fn);

  bool changed = false;
  while (!blocks_.empty() || !ssa_edge_uses_.empty()) {
    // Simulate all blocks first. Simulating blocks will add SSA edges to
    // follow after all the blocks have been simulated.
    if (!blocks_.empty()) {
      auto block = blocks_.front();
      changed |= Simulate(block);
      blocks_.pop();
      continue;
    }

    // Simulate edges from the SSA queue.
    if (!ssa_edge_uses_.empty()) {
      Instruction* instr = ssa_edge_uses_.front();
      changed |= Simulate(instr);
      ssa_edge_uses_.pop();
    }
  }

#ifndef NDEBUG
  // Verify all visited values have settled. No value that has been simulated
  // should end on not interesting.
  fn->ForEachInst([this](Instruction* inst) {
    assert(
        (!HasStatus(inst) || Status(inst) != SSAPropagator::kNotInteresting) &&
        "Unsettled value");
  });
#endif

  return changed;
}